

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O1

void __thiscall FBX::Decoder::initVersion(Decoder *this)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_type __n;
  allocator_type local_2a;
  value_type_conflict local_29;
  vector<char,_std::allocator<char>_> local_28;
  
  sVar2 = (this->stream).cursor;
  if (this->isuInt32 == true) {
    sVar3 = sVar2 + 4;
  }
  else {
    sVar3 = sVar2 + 8;
  }
  (this->stream).cursor = sVar3;
  iVar1 = *(int *)((this->stream).data + sVar2);
  this->version = iVar1;
  __n = 0x19;
  if (iVar1 < 0x1d4c) {
    __n = 0xd;
  }
  this->blockLength = __n;
  this->isuInt32 = iVar1 < 0x1d4c;
  local_29 = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&local_28,__n,&local_29,&local_2a);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&this->blockData,&local_28);
  if (local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Decoder::initVersion() {
        version = readuInt();

        if (version < 7500) {
            blockLength = 13;
            isuInt32 = true;
        } else {
            blockLength = 25;
            isuInt32 = false;
        }
        blockData = std::vector(blockLength, '\0');
    }